

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86::create_pipeline(ConvolutionDepthWise_x86 *this,Option *opt)

{
  int *piVar1;
  void *pvVar2;
  long *plVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  pointer ppLVar8;
  _func_int *p_Var9;
  Layer *pLVar10;
  long lVar11;
  int iVar12;
  pointer ppLVar13;
  int iVar14;
  long lVar15;
  bool bVar16;
  ParamDict pd;
  ModelBinFromMatArray local_b20;
  long local_b10;
  undefined4 local_b08;
  long *local_b00;
  undefined4 local_af8;
  undefined4 uStack_af4;
  undefined4 uStack_af0;
  undefined4 uStack_aec;
  long local_ae8;
  int local_ae0;
  int local_adc;
  void *local_ad8;
  int *piStack_ad0;
  size_t local_ac8;
  int local_ac0;
  Allocator *local_ab8;
  int local_ab0;
  int iStack_aac;
  undefined8 uStack_aa8;
  size_t local_aa0;
  Option *local_a90;
  _func_int **local_a88;
  undefined4 uStack_a80;
  undefined4 uStack_a7c;
  undefined4 uStack_a78;
  undefined4 uStack_a74;
  undefined4 uStack_a70;
  long *local_a68;
  undefined1 auStack_a60 [8];
  undefined1 local_a58 [8];
  long lStack_a50;
  Mat local_a48;
  _func_int **local_a08;
  Mat *pMStack_a00;
  long local_9f8;
  undefined4 local_9f0;
  long *local_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  long local_9d0;
  _func_int **local_9c8;
  Mat *pMStack_9c0;
  long lStack_9b8;
  undefined4 uStack_9b0;
  long *local_9a8;
  undefined4 local_9a0;
  undefined4 uStack_99c;
  undefined4 uStack_998;
  undefined4 uStack_994;
  undefined8 local_990;
  _func_int **local_988;
  Mat *pMStack_980;
  long lStack_978;
  undefined4 uStack_970;
  long *local_968;
  undefined4 local_960;
  undefined4 uStack_95c;
  undefined4 uStack_958;
  undefined4 uStack_954;
  undefined8 local_950;
  long local_940;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_938;
  ParamDict local_930;
  
  local_a90 = opt;
  switch(*(undefined4 *)(&this->field_0xc0 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])) {
  case 1:
    pLVar10 = create_layer(0x1a);
    this->activation = pLVar10;
    ParamDict::ParamDict(&local_930);
    (*this->activation->_vptr_Layer[2])(this->activation,&local_930);
    lVar15 = 0x8c0;
    do {
      piVar1 = *(int **)((long)&local_930.params[0].v.data + lVar15);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          pvVar2 = *(void **)((long)&local_930.params[0].type + lVar15);
          plVar3 = *(long **)((long)&local_930.params[0].v.elempack + lVar15);
          if (plVar3 == (long *)0x0) {
            if (pvVar2 != (void *)0x0) {
              free(pvVar2);
            }
          }
          else {
            (**(code **)(*plVar3 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_930.params[0].v.data + lVar15 + 4) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar15 + 4) = 0;
      *(undefined8 *)((long)&local_930.params[0].type + lVar15) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.data + lVar15) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar15) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.dims + lVar15) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.h + lVar15) = 0;
      lVar15 = lVar15 + -0x48;
    } while (lVar15 != -0x40);
    break;
  case 2:
    pLVar10 = create_layer(0x1a);
    this->activation = pLVar10;
    ParamDict::ParamDict(&local_930);
    ParamDict::set(&local_930,0,
                   **(float **)(&this->field_0xc8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]))
    ;
    (*this->activation->_vptr_Layer[2])(this->activation,&local_930);
    lVar15 = 0x8c0;
    do {
      piVar1 = *(int **)((long)&local_930.params[0].v.data + lVar15);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          pvVar2 = *(void **)((long)&local_930.params[0].type + lVar15);
          plVar3 = *(long **)((long)&local_930.params[0].v.elempack + lVar15);
          if (plVar3 == (long *)0x0) {
            if (pvVar2 != (void *)0x0) {
              free(pvVar2);
            }
          }
          else {
            (**(code **)(*plVar3 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_930.params[0].v.data + lVar15 + 4) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar15 + 4) = 0;
      *(undefined8 *)((long)&local_930.params[0].type + lVar15) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.data + lVar15) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar15) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.dims + lVar15) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.h + lVar15) = 0;
      lVar15 = lVar15 + -0x48;
    } while (lVar15 != -0x40);
    break;
  case 3:
    pLVar10 = create_layer(0x36);
    this->activation = pLVar10;
    ParamDict::ParamDict(&local_930);
    ParamDict::set(&local_930,0,
                   **(float **)(&this->field_0xc8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]))
    ;
    ParamDict::set(&local_930,1,
                   *(float *)(*(long *)(&this->field_0xc8 +
                                       (long)this->_vptr_ConvolutionDepthWise_x86[-3]) + 4));
    (*this->activation->_vptr_Layer[2])(this->activation,&local_930);
    lVar15 = 0x8c0;
    do {
      piVar1 = *(int **)((long)&local_930.params[0].v.data + lVar15);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          pvVar2 = *(void **)((long)&local_930.params[0].type + lVar15);
          plVar3 = *(long **)((long)&local_930.params[0].v.elempack + lVar15);
          if (plVar3 == (long *)0x0) {
            if (pvVar2 != (void *)0x0) {
              free(pvVar2);
            }
          }
          else {
            (**(code **)(*plVar3 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_930.params[0].v.data + lVar15 + 4) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar15 + 4) = 0;
      *(undefined8 *)((long)&local_930.params[0].type + lVar15) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.data + lVar15) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar15) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.dims + lVar15) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.h + lVar15) = 0;
      lVar15 = lVar15 + -0x48;
    } while (lVar15 != -0x40);
    break;
  case 4:
    pLVar10 = create_layer(0x1e);
    this->activation = pLVar10;
    ParamDict::ParamDict(&local_930);
    (*this->activation->_vptr_Layer[2])(this->activation,&local_930);
    lVar15 = 0x8c0;
    do {
      piVar1 = *(int **)((long)&local_930.params[0].v.data + lVar15);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          pvVar2 = *(void **)((long)&local_930.params[0].type + lVar15);
          plVar3 = *(long **)((long)&local_930.params[0].v.elempack + lVar15);
          if (plVar3 == (long *)0x0) {
            if (pvVar2 != (void *)0x0) {
              free(pvVar2);
            }
          }
          else {
            (**(code **)(*plVar3 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_930.params[0].v.data + lVar15 + 4) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar15 + 4) = 0;
      *(undefined8 *)((long)&local_930.params[0].type + lVar15) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.data + lVar15) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar15) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.dims + lVar15) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.h + lVar15) = 0;
      lVar15 = lVar15 + -0x48;
    } while (lVar15 != -0x40);
  }
  pLVar10 = this->activation;
  if (pLVar10 != (Layer *)0x0) {
    (*pLVar10->_vptr_Layer[4])(pLVar10,local_a90);
  }
  ppLVar13 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  p_Var9 = this->_vptr_ConvolutionDepthWise_x86[-3];
  iVar14 = *(int *)(&this->field_0x88 + (long)p_Var9) * *(int *)(&this->field_0x84 + (long)p_Var9);
  iVar7 = *(int *)(&this->field_0x80 + (long)p_Var9);
  iVar12 = *(int *)(&this->field_0xb8 + (long)p_Var9);
  uVar4 = (long)*(int *)(&this->field_0xb4 + (long)p_Var9) / (long)iVar12;
  uVar4 = (long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) / (long)iVar14;
  ppLVar8 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppLVar8 - (long)ppLVar13) >> 3)) {
    lVar15 = 0;
    do {
      if (ppLVar13[lVar15] != (Layer *)0x0) {
        (*ppLVar13[lVar15]->_vptr_Layer[1])();
        ppLVar13 = (this->group_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppLVar8 = (this->group_ops).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < (int)((ulong)((long)ppLVar8 - (long)ppLVar13) >> 3));
  }
  iVar12 = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
                (long)(iVar7 / iVar12)) * iVar12;
  if (ppLVar8 != ppLVar13) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar13;
  }
  p_Var9 = this->_vptr_ConvolutionDepthWise_x86[-3];
  iVar7 = *(int *)(&this->field_0xb8 + (long)p_Var9);
  local_ae0 = *(int *)(&this->field_0x80 + (long)p_Var9);
  if ((((iVar12 == iVar7) && (iVar12 == local_ae0)) &&
      (local_ae0 = iVar12, *(int *)(&this->field_0x84 + (long)p_Var9) == 3)) &&
     (((*(int *)(&this->field_0x88 + (long)p_Var9) == 3 &&
       (*(int *)(&this->field_0x8c + (long)p_Var9) == 1)) &&
      (*(int *)(&this->field_0x90 + (long)p_Var9) == 1)))) {
    if (*(int *)(&this->field_0x94 + (long)p_Var9) == 2) {
      bVar16 = *(int *)(&this->field_0x98 + (long)p_Var9) == 2;
    }
    else {
      if (*(int *)(&this->field_0x94 + (long)p_Var9) != 1) goto LAB_0015e26f;
      bVar16 = *(int *)(&this->field_0x98 + (long)p_Var9) == 1;
    }
    if (bVar16) {
      return 0;
    }
  }
LAB_0015e26f:
  local_938 = &this->group_ops;
  local_ae0 = local_ae0 / iVar7;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_938,(long)iVar7);
  if (0 < *(int *)(&this->field_0xb8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])) {
    iVar7 = (iVar12 / iVar7) * iVar14 * local_ae0;
    local_940 = (long)local_ae0;
    p_Var9 = this->_vptr_ConvolutionDepthWise_x86[-3];
    lVar15 = 0;
    local_adc = iVar7;
    do {
      local_ac8 = *(size_t *)(&this->field_0x118 + (long)p_Var9);
      local_ad8 = (void *)(lVar15 * iVar7 * local_ac8 + *(long *)(&this->field_0x108 + (long)p_Var9)
                          );
      local_ac0 = *(int *)(&this->field_0x120 + (long)p_Var9);
      local_ab8 = *(Allocator **)(&this->field_0x128 + (long)p_Var9);
      piStack_ad0 = (int *)0x0;
      local_ab0 = 1;
      uStack_aa8._0_4_ = 1;
      uStack_aa8._4_4_ = 1;
      uStack_a78 = 0;
      uStack_a74 = 0;
      uStack_a70 = 0;
      local_a88 = (_func_int **)0x0;
      local_a58 = (undefined1  [8])0x0;
      lStack_a50 = 0;
      local_a68 = (long *)0x0;
      auStack_a60 = (undefined1  [8])0x0;
      if (*(int *)(&this->field_0xb0 + (long)p_Var9) != 0) {
        local_a68 = *(long **)(&this->field_0x168 + (long)p_Var9);
        uStack_a70 = *(undefined4 *)(&this->field_0x160 + (long)p_Var9);
        lVar11 = *(long *)(&this->field_0x158 + (long)p_Var9);
        local_a88 = (_func_int **)
                    (lVar15 * local_940 * lVar11 + *(long *)(&this->field_0x148 + (long)p_Var9));
        uStack_a78 = (undefined4)lVar11;
        uStack_a74 = (undefined4)((ulong)lVar11 >> 0x20);
        auStack_a60._4_4_ = local_ae0;
        auStack_a60._0_4_ = 1;
        local_a58 = (undefined1  [8])0x100000001;
        lStack_a50 = local_940;
      }
      uStack_a7c = 0;
      uStack_a80 = 0;
      iStack_aac = iVar7;
      local_aa0 = (long)iVar7;
      pLVar10 = create_layer(6);
      ParamDict::ParamDict(&local_930);
      ParamDict::set(&local_930,0,local_ae0);
      ParamDict::set(&local_930,1,
                     *(int *)(&this->field_0x84 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&local_930,0xb,
                     *(int *)(&this->field_0x88 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&local_930,2,
                     *(int *)(&this->field_0x8c + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&local_930,0xc,
                     *(int *)(&this->field_0x90 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&local_930,3,
                     *(int *)(&this->field_0x94 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&local_930,0xd,
                     *(int *)(&this->field_0x98 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&local_930,4,0);
      ParamDict::set(&local_930,0xe,0);
      ParamDict::set(&local_930,5,
                     *(int *)(&this->field_0xb0 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&local_930,6,local_adc);
      ParamDict::set(&local_930,8,
                     *(int *)(&this->field_0xbc + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      (*pLVar10->_vptr_Layer[2])(pLVar10,&local_930);
      if (*(int *)(&this->field_0xb0 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) == 0) {
        lVar11 = 0x20;
        do {
          *(undefined8 *)(auStack_a60 + lVar11 + 4) = 0;
          *(undefined8 *)(local_a58 + lVar11 + 4) = 0;
          *(undefined8 *)((long)&local_a68 + lVar11) = 0;
          *(undefined8 *)(auStack_a60 + lVar11) = 0;
          *(undefined8 *)((long)&local_a48.data + lVar11) = 0;
          *(undefined8 *)((long)&local_a48.refcount + lVar11) = 0;
          *(undefined8 *)((long)&local_a48.elemsize + lVar11) = 0;
          *(undefined8 *)((long)&local_a48.elempack + lVar11) = 0;
          lVar11 = lVar11 + 0x40;
        } while (lVar11 != 0xe0);
        if (local_a48.refcount != (int *)0x0) {
          LOCK();
          *local_a48.refcount = *local_a48.refcount + -1;
          UNLOCK();
          if (*local_a48.refcount == 0) {
            if (local_a48.allocator == (Allocator *)0x0) {
              if (local_a48.data != (void *)0x0) {
                free(local_a48.data);
              }
            }
            else {
              (*(local_a48.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_a48.data = local_ad8;
        local_a48.refcount = piStack_ad0;
        local_a48.elemsize = local_ac8;
        local_a48.elempack = local_ac0;
        local_a48.allocator = local_ab8;
        local_a48.w = iStack_aac;
        local_a48.dims = local_ab0;
        local_a48.h = (int)uStack_aa8;
        local_a48.c = uStack_aa8._4_4_;
        local_a48.cstep = local_aa0;
        p_Var9 = this->_vptr_ConvolutionDepthWise_x86[-3];
        if (*(int *)(&this->field_0xbc + (long)p_Var9) != 0) {
          local_b10 = *(long *)(&this->field_0x198 + (long)p_Var9);
          local_b20.super_ModelBin._vptr_ModelBin =
               (_func_int **)(local_b10 * lVar15 + *(long *)(&this->field_0x188 + (long)p_Var9));
          local_b08 = *(undefined4 *)(&this->field_0x1a0 + (long)p_Var9);
          local_b00 = *(long **)(&this->field_0x1a8 + (long)p_Var9);
          local_b20.weights = (Mat *)0x0;
          local_af8 = 1;
          uStack_af4 = 1;
          uStack_af0 = 1;
          uStack_aec = 1;
          local_ae8 = 1;
          if (pMStack_a00 != (Mat *)0x0) {
            LOCK();
            *(int *)&pMStack_a00->data = *(int *)&pMStack_a00->data + -1;
            UNLOCK();
            if (*(int *)&pMStack_a00->data == 0) {
              if (local_9e8 == (long *)0x0) {
                if (local_a08 != (_func_int **)0x0) {
                  free(local_a08);
                }
              }
              else {
                (**(code **)(*local_9e8 + 0x18))();
              }
            }
          }
          local_a08 = local_b20.super_ModelBin._vptr_ModelBin;
          pMStack_a00 = local_b20.weights;
          local_9f8 = local_b10;
          local_9f0 = local_b08;
          local_9e8 = local_b00;
          local_9e0 = CONCAT44(uStack_af4,local_af8);
          uStack_9d8 = CONCAT44(uStack_aec,uStack_af0);
          local_9d0 = local_ae8;
          if (local_b20.weights != (Mat *)0x0) {
            LOCK();
            *(int *)&(local_b20.weights)->data = *(int *)&(local_b20.weights)->data + -1;
            UNLOCK();
            if (*(int *)&(local_b20.weights)->data == 0) {
              if (local_b00 == (long *)0x0) {
                if (local_b20.super_ModelBin._vptr_ModelBin != (_func_int **)0x0) {
                  free(local_b20.super_ModelBin._vptr_ModelBin);
                }
              }
              else {
                (**(code **)(*local_b00 + 0x18))();
              }
            }
          }
          p_Var9 = this->_vptr_ConvolutionDepthWise_x86[-3];
          local_b10 = *(long *)(&this->field_0x1d8 + (long)p_Var9);
          local_b20.super_ModelBin._vptr_ModelBin =
               (_func_int **)(local_b10 * lVar15 + *(long *)(&this->field_0x1c8 + (long)p_Var9));
          local_b08 = *(undefined4 *)(&this->field_0x1e0 + (long)p_Var9);
          local_b00 = *(long **)(&this->field_0x1e8 + (long)p_Var9);
          local_b20.weights = (Mat *)0x0;
          local_af8 = 1;
          uStack_af4 = 1;
          uStack_af0 = 1;
          uStack_aec = 1;
          local_ae8 = 1;
          if (pMStack_9c0 != (Mat *)0x0) {
            LOCK();
            *(int *)&pMStack_9c0->data = *(int *)&pMStack_9c0->data + -1;
            UNLOCK();
            if (*(int *)&pMStack_9c0->data == 0) {
              if (local_9a8 == (long *)0x0) {
                if (local_9c8 != (_func_int **)0x0) {
                  free(local_9c8);
                }
              }
              else {
                (**(code **)(*local_9a8 + 0x18))();
              }
            }
          }
          local_9c8 = local_b20.super_ModelBin._vptr_ModelBin;
          pMStack_9c0 = local_b20.weights;
          lStack_9b8 = local_b10;
          uStack_9b0 = local_b08;
          local_9a8 = local_b00;
          local_9a0 = local_af8;
          uStack_99c = uStack_af4;
          uStack_998 = uStack_af0;
          uStack_994 = uStack_aec;
          local_990 = local_ae8;
          if (local_b20.weights != (Mat *)0x0) {
            LOCK();
            *(int *)&(local_b20.weights)->data = *(int *)&(local_b20.weights)->data + -1;
            UNLOCK();
            if (*(int *)&(local_b20.weights)->data == 0) {
              if (local_b00 == (long *)0x0) {
                if (local_b20.super_ModelBin._vptr_ModelBin != (_func_int **)0x0) {
                  free(local_b20.super_ModelBin._vptr_ModelBin);
                }
              }
              else {
                (**(code **)(*local_b00 + 0x18))();
              }
            }
          }
        }
        ModelBinFromMatArray::ModelBinFromMatArray(&local_b20,&local_a48);
        (*pLVar10->_vptr_Layer[3])(pLVar10,&local_b20);
        ModelBin::~ModelBin(&local_b20.super_ModelBin);
        lVar11 = 0x80;
        do {
          piVar1 = *(int **)((long)&local_a48.refcount + lVar11);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              pvVar2 = *(void **)((long)&local_a48.data + lVar11);
              plVar3 = *(long **)((long)&local_a48.allocator + lVar11);
              if (plVar3 == (long *)0x0) {
                if (pvVar2 != (void *)0x0) {
                  free(pvVar2);
                }
              }
              else {
                (**(code **)(*plVar3 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_a48.refcount + lVar11 + 4) = 0;
          *(undefined8 *)((long)&local_a48.elemsize + lVar11 + 4) = 0;
          *(undefined8 *)((long)&local_a48.data + lVar11) = 0;
          *(undefined8 *)((long)&local_a48.refcount + lVar11) = 0;
          *(undefined8 *)((long)&local_a48.dims + lVar11) = 0;
          *(undefined8 *)((long)&local_a48.h + lVar11) = 0;
          *(undefined8 *)((long)&local_a48.cstep + lVar11) = 0;
          lVar11 = lVar11 + -0x40;
        } while (lVar11 != -0x40);
      }
      else {
        lVar11 = 0;
        do {
          *(undefined8 *)((long)&local_a48.refcount + lVar11 + 4) = 0;
          *(undefined8 *)((long)&local_a48.elemsize + lVar11 + 4) = 0;
          *(undefined8 *)((long)&local_a48.data + lVar11) = 0;
          *(undefined8 *)((long)&local_a48.refcount + lVar11) = 0;
          *(undefined8 *)((long)&local_a48.allocator + lVar11) = 0;
          *(undefined8 *)((long)&local_a48.dims + lVar11) = 0;
          *(undefined8 *)((long)&local_a48.h + lVar11) = 0;
          *(undefined8 *)((long)&local_a48.cstep + lVar11) = 0;
          lVar11 = lVar11 + 0x40;
        } while (lVar11 != 0x100);
        if (local_a48.refcount != (int *)0x0) {
          LOCK();
          *local_a48.refcount = *local_a48.refcount + -1;
          UNLOCK();
          if (*local_a48.refcount == 0) {
            if (local_a48.allocator == (Allocator *)0x0) {
              if (local_a48.data != (void *)0x0) {
                free(local_a48.data);
              }
            }
            else {
              (*(local_a48.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_a48.data = local_ad8;
        local_a48.refcount = piStack_ad0;
        local_a48.elemsize = local_ac8;
        local_a48.elempack = local_ac0;
        local_a48.allocator = local_ab8;
        local_a48.w = iStack_aac;
        local_a48.dims = local_ab0;
        uVar5._0_4_ = (int)uStack_aa8;
        uVar5._4_4_ = uStack_aa8._4_4_;
        local_a48.h = (int)uStack_aa8;
        local_a48.c = uStack_aa8._4_4_;
        local_a48.cstep = local_aa0;
        piVar1 = (int *)CONCAT44(uStack_a7c,uStack_a80);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        uVar6 = uVar5;
        if (pMStack_a00 != (Mat *)0x0) {
          LOCK();
          *(int *)&pMStack_a00->data = *(int *)&pMStack_a00->data + -1;
          UNLOCK();
          uVar6 = local_a48._48_8_;
          if (*(int *)&pMStack_a00->data == 0) {
            if (local_9e8 == (long *)0x0) {
              if (local_a08 != (_func_int **)0x0) {
                local_a48._48_8_ = uVar5;
                free(local_a08);
                uVar6 = local_a48._48_8_;
              }
            }
            else {
              local_a48._48_8_ = uVar5;
              (**(code **)(*local_9e8 + 0x18))();
              uVar6 = local_a48._48_8_;
            }
          }
        }
        local_a48._48_8_ = uVar6;
        pMStack_a00 = (Mat *)CONCAT44(uStack_a7c,uStack_a80);
        local_a08 = local_a88;
        local_9f8 = CONCAT44(uStack_a74,uStack_a78);
        local_9f0 = uStack_a70;
        local_9e8 = local_a68;
        local_9e0 = auStack_a60;
        uStack_9d8 = local_a58;
        local_9d0 = lStack_a50;
        p_Var9 = this->_vptr_ConvolutionDepthWise_x86[-3];
        if (*(int *)(&this->field_0xbc + (long)p_Var9) != 0) {
          local_b10 = *(long *)(&this->field_0x198 + (long)p_Var9);
          local_b20.super_ModelBin._vptr_ModelBin =
               (_func_int **)(local_b10 * lVar15 + *(long *)(&this->field_0x188 + (long)p_Var9));
          local_b08 = *(undefined4 *)(&this->field_0x1a0 + (long)p_Var9);
          local_b00 = *(long **)(&this->field_0x1a8 + (long)p_Var9);
          local_b20.weights = (Mat *)0x0;
          local_af8 = 1;
          uStack_af4 = 1;
          uStack_af0 = 1;
          uStack_aec = 1;
          local_ae8 = 1;
          if (pMStack_9c0 != (Mat *)0x0) {
            LOCK();
            *(int *)&pMStack_9c0->data = *(int *)&pMStack_9c0->data + -1;
            UNLOCK();
            if (*(int *)&pMStack_9c0->data == 0) {
              if (local_9a8 == (long *)0x0) {
                if (local_9c8 != (_func_int **)0x0) {
                  free(local_9c8);
                }
              }
              else {
                (**(code **)(*local_9a8 + 0x18))();
              }
            }
          }
          local_9c8 = local_b20.super_ModelBin._vptr_ModelBin;
          pMStack_9c0 = local_b20.weights;
          lStack_9b8 = local_b10;
          uStack_9b0 = local_b08;
          local_9a8 = local_b00;
          local_9a0 = local_af8;
          uStack_99c = uStack_af4;
          uStack_998 = uStack_af0;
          uStack_994 = uStack_aec;
          local_990 = local_ae8;
          if (local_b20.weights != (Mat *)0x0) {
            LOCK();
            *(int *)&(local_b20.weights)->data = *(int *)&(local_b20.weights)->data + -1;
            UNLOCK();
            if (*(int *)&(local_b20.weights)->data == 0) {
              if (local_b00 == (long *)0x0) {
                if (local_b20.super_ModelBin._vptr_ModelBin != (_func_int **)0x0) {
                  free(local_b20.super_ModelBin._vptr_ModelBin);
                }
              }
              else {
                (**(code **)(*local_b00 + 0x18))();
              }
            }
          }
          p_Var9 = this->_vptr_ConvolutionDepthWise_x86[-3];
          local_b10 = *(long *)(&this->field_0x1d8 + (long)p_Var9);
          local_b20.super_ModelBin._vptr_ModelBin =
               (_func_int **)(local_b10 * lVar15 + *(long *)(&this->field_0x1c8 + (long)p_Var9));
          local_b08 = *(undefined4 *)(&this->field_0x1e0 + (long)p_Var9);
          local_b00 = *(long **)(&this->field_0x1e8 + (long)p_Var9);
          local_b20.weights = (Mat *)0x0;
          local_af8 = 1;
          uStack_af4 = 1;
          uStack_af0 = 1;
          uStack_aec = 1;
          local_ae8 = 1;
          if (pMStack_980 != (Mat *)0x0) {
            LOCK();
            *(int *)&pMStack_980->data = *(int *)&pMStack_980->data + -1;
            UNLOCK();
            if (*(int *)&pMStack_980->data == 0) {
              if (local_968 == (long *)0x0) {
                if (local_988 != (_func_int **)0x0) {
                  free(local_988);
                }
              }
              else {
                (**(code **)(*local_968 + 0x18))();
              }
            }
          }
          local_988 = local_b20.super_ModelBin._vptr_ModelBin;
          pMStack_980 = local_b20.weights;
          lStack_978 = local_b10;
          uStack_970 = local_b08;
          local_968 = local_b00;
          local_960 = local_af8;
          uStack_95c = uStack_af4;
          uStack_958 = uStack_af0;
          uStack_954 = uStack_aec;
          local_950 = local_ae8;
          if (local_b20.weights != (Mat *)0x0) {
            LOCK();
            *(int *)&(local_b20.weights)->data = *(int *)&(local_b20.weights)->data + -1;
            UNLOCK();
            if (*(int *)&(local_b20.weights)->data == 0) {
              if (local_b00 == (long *)0x0) {
                if (local_b20.super_ModelBin._vptr_ModelBin != (_func_int **)0x0) {
                  free(local_b20.super_ModelBin._vptr_ModelBin);
                }
              }
              else {
                (**(code **)(*local_b00 + 0x18))();
              }
            }
          }
        }
        ModelBinFromMatArray::ModelBinFromMatArray(&local_b20,&local_a48);
        (*pLVar10->_vptr_Layer[3])(pLVar10,&local_b20);
        ModelBin::~ModelBin(&local_b20.super_ModelBin);
        lVar11 = 0xc0;
        do {
          piVar1 = *(int **)((long)&local_a48.refcount + lVar11);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              pvVar2 = *(void **)((long)&local_a48.data + lVar11);
              plVar3 = *(long **)((long)&local_a48.allocator + lVar11);
              if (plVar3 == (long *)0x0) {
                if (pvVar2 != (void *)0x0) {
                  free(pvVar2);
                }
              }
              else {
                (**(code **)(*plVar3 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_a48.refcount + lVar11 + 4) = 0;
          *(undefined8 *)((long)&local_a48.elemsize + lVar11 + 4) = 0;
          *(undefined8 *)((long)&local_a48.data + lVar11) = 0;
          *(undefined8 *)((long)&local_a48.refcount + lVar11) = 0;
          *(undefined8 *)((long)&local_a48.dims + lVar11) = 0;
          *(undefined8 *)((long)&local_a48.h + lVar11) = 0;
          *(undefined8 *)((long)&local_a48.cstep + lVar11) = 0;
          lVar11 = lVar11 + -0x40;
        } while (lVar11 != -0x40);
      }
      (*pLVar10->_vptr_Layer[4])(pLVar10,local_a90);
      (local_938->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar15] = pLVar10;
      lVar11 = 0x8c0;
      do {
        piVar1 = *(int **)((long)&local_930.params[0].v.data + lVar11);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pvVar2 = *(void **)((long)&local_930.params[0].type + lVar11);
            plVar3 = *(long **)((long)&local_930.params[0].v.elempack + lVar11);
            if (plVar3 == (long *)0x0) {
              if (pvVar2 != (void *)0x0) {
                free(pvVar2);
              }
            }
            else {
              (**(code **)(*plVar3 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_930.params[0].v.data + lVar11 + 4) = 0;
        *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar11 + 4) = 0;
        *(undefined8 *)((long)&local_930.params[0].type + lVar11) = 0;
        *(undefined8 *)((long)&local_930.params[0].v.data + lVar11) = 0;
        *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar11) = 0;
        *(undefined8 *)((long)&local_930.params[0].v.dims + lVar11) = 0;
        *(undefined8 *)((long)&local_930.params[0].v.h + lVar11) = 0;
        lVar11 = lVar11 + -0x48;
      } while (lVar11 != -0x40);
      piVar1 = (int *)CONCAT44(uStack_a7c,uStack_a80);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_a68 == (long *)0x0) {
            if (local_a88 != (_func_int **)0x0) {
              free(local_a88);
            }
          }
          else {
            (**(code **)(*local_a68 + 0x18))();
          }
        }
      }
      if (piStack_ad0 != (int *)0x0) {
        LOCK();
        *piStack_ad0 = *piStack_ad0 + -1;
        UNLOCK();
        if (*piStack_ad0 == 0) {
          if (local_ab8 == (Allocator *)0x0) {
            if (local_ad8 != (void *)0x0) {
              free(local_ad8);
            }
          }
          else {
            (*local_ab8->_vptr_Allocator[3])();
          }
        }
      }
      lVar15 = lVar15 + 1;
      p_Var9 = this->_vptr_ConvolutionDepthWise_x86[-3];
    } while (lVar15 < *(int *)(&this->field_0xb8 + (long)p_Var9));
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86::create_pipeline(const Option& opt)
{
    if (activation_type == 1)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }
    else if (activation_type == 2)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        pd.set(0, activation_params[0]);// slope
        activation->load_param(pd);
    }
    else if (activation_type == 3)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Clip);

        ncnn::ParamDict pd;
        pd.set(0, activation_params[0]);// min
        pd.set(1, activation_params[1]);// max
        activation->load_param(pd);
    }
    else if (activation_type == 4)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Sigmoid);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }

    if (activation)
    {
        activation->create_pipeline(opt);
    }

    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i=0; i<(int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();      

    if (channels == group && group == num_output)
    {
        // depth-wise specific
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1)
        {
            if ((stride_w == 1 && stride_h == 1) || (stride_w == 2 && stride_h == 2))
            {
                return 0;
            }
        }
    }    

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);     

    for (int g=0; g<group; g++)
    {  
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g);
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g);// num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);// pad_w
        pd.set(14, 0);// pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g);// weight_data_size
        pd.set(8, int8_scale_term);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[4];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

            if (int8_scale_term)
            {
                weights[2] = weight_data_int8_scales.range(g, 1);
                weights[3] = bottom_blob_int8_scales.range(g, 1);     
            }

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[3];
            weights[0] = weight_data_g;

            if (int8_scale_term)
            {
                weights[1] = weight_data_int8_scales.range(g, 1);
                weights[2] = bottom_blob_int8_scales.range(g, 1);
            }

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }      

    return 0;
}